

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWmonitor *pGVar1;
  GLFWvidmode *pGVar2;
  char *pcVar3;
  GLFWvidmode *mode;
  GLFWmonitor *monitor;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  glfwGetTime();
  pcVar3 = "released";
  if (action == 1) {
    pcVar3 = "pressed";
  }
  printf("%0.2f Key %s\n",pcVar3);
  if (action == 1) {
    if (key == 0x49) {
      glfwIconifyWindow(window);
    }
    else if (key == 0x4d) {
      glfwMaximizeWindow(window);
    }
    else if (key == 0x52) {
      glfwRestoreWindow(window);
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
    else if (((key == 0x101) || (key == 300)) && (mods == 4)) {
      pGVar1 = glfwGetWindowMonitor(window);
      if (pGVar1 == (GLFWmonitor *)0x0) {
        pGVar1 = glfwGetPrimaryMonitor();
        if (pGVar1 != (GLFWmonitor *)0x0) {
          pGVar2 = glfwGetVideoMode(pGVar1);
          glfwGetWindowPos(window,&windowed_xpos,&windowed_ypos);
          glfwGetWindowSize(window,&windowed_width,&windowed_height);
          glfwSetWindowMonitor(window,pGVar1,0,0,pGVar2->width,pGVar2->height,pGVar2->refreshRate);
        }
      }
      else {
        glfwSetWindowMonitor
                  (window,(GLFWmonitor *)0x0,windowed_xpos,windowed_ypos,windowed_width,
                   windowed_height,0);
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    printf("%0.2f Key %s\n",
           glfwGetTime(),
           action == GLFW_PRESS ? "pressed" : "released");

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_I:
            glfwIconifyWindow(window);
            break;
        case GLFW_KEY_M:
            glfwMaximizeWindow(window);
            break;
        case GLFW_KEY_R:
            glfwRestoreWindow(window);
            break;
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
            {
                glfwSetWindowMonitor(window, NULL,
                                     windowed_xpos, windowed_ypos,
                                     windowed_width, windowed_height,
                                     0);
            }
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                if (monitor)
                {
                    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                    glfwGetWindowPos(window, &windowed_xpos, &windowed_ypos);
                    glfwGetWindowSize(window, &windowed_width, &windowed_height);
                    glfwSetWindowMonitor(window, monitor,
                                         0, 0, mode->width, mode->height,
                                         mode->refreshRate);
                }
            }

            break;
        }
    }
}